

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

bool __thiscall
duckdb::roaring::RoaringAnalyzeState::HasEnoughSpaceInSegment
          (RoaringAnalyzeState *this,idx_t required_space)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  
  iVar1 = this->metadata_size;
  iVar2 = this->data_size;
  iVar3 = CompressionInfo::GetBlockSize(&(this->super_AnalyzeState).info);
  return required_space <= iVar3 - (iVar1 + iVar2);
}

Assistant:

bool RoaringAnalyzeState::HasEnoughSpaceInSegment(idx_t required_space) {
	auto space_used = data_size + metadata_size;
	D_ASSERT(space_used <= info.GetBlockSize());
	idx_t remaining_space = info.GetBlockSize() - space_used;
	if (required_space > remaining_space) {
		return false;
	}
	return true;
}